

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistry.cpp
# Opt level: O0

void __thiscall TestRegistry::runAllTests(TestRegistry *this,TestResult *result)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long *in_RSI;
  TestResult *in_RDI;
  UtestShell *test;
  bool groupStart;
  TestRegistry *in_stack_00000028;
  undefined7 in_stack_ffffffffffffffe8;
  byte bVar3;
  UtestShell *test_00;
  
  bVar3 = 1;
  (**(code **)(*in_RSI + 0x10))();
  test_00 = (UtestShell *)in_RDI->output_;
  while (test_00 != (UtestShell *)0x0) {
    if ((in_RDI->failureCount_ & 1) != 0) {
      (*test_00->_vptr_UtestShell[0x20])();
    }
    if ((in_RDI->filteredOutCount_ & 1) != 0) {
      (*test_00->_vptr_UtestShell[0x21])();
    }
    if ((bVar3 & 1) != 0) {
      (**(code **)(*in_RSI + 0x20))(in_RSI,test_00);
      bVar3 = 0;
    }
    (**(code **)(*in_RSI + 0x40))();
    bVar1 = testShouldRun((TestRegistry *)CONCAT17(bVar3,in_stack_ffffffffffffffe8),test_00,in_RDI);
    if (bVar1) {
      (**(code **)(*in_RSI + 0x30))(in_RSI,test_00);
      (*test_00->_vptr_UtestShell[0x24])(test_00,in_RDI->checkCount_,in_RSI);
      (**(code **)(*in_RSI + 0x38))(in_RSI,test_00);
    }
    bVar1 = endOfGroup(in_stack_00000028,(UtestShell *)this);
    if (bVar1) {
      bVar3 = 1;
      (**(code **)(*in_RSI + 0x28))(in_RSI,test_00);
    }
    iVar2 = (*test_00->_vptr_UtestShell[3])();
    test_00 = (UtestShell *)CONCAT44(extraout_var,iVar2);
  }
  (**(code **)(*in_RSI + 0x18))();
  *(int *)((long)&in_RDI->failureCount_ + 4) = *(int *)((long)&in_RDI->failureCount_ + 4) + 1;
  return;
}

Assistant:

void TestRegistry::runAllTests(TestResult& result)
{
    bool groupStart = true;

    result.testsStarted();
    for (UtestShell *test = tests_; test != NULLPTR; test = test->getNext()) {
        if (runInSeperateProcess_) test->setRunInSeperateProcess();
        if (runIgnored_) test->setRunIgnored();

        if (groupStart) {
            result.currentGroupStarted(test);
            groupStart = false;
        }

        result.countTest();
        if (testShouldRun(test, result)) {
            result.currentTestStarted(test);
            test->runOneTest(firstPlugin_, result);
            result.currentTestEnded(test);
        }

        if (endOfGroup(test)) {
            groupStart = true;
            result.currentGroupEnded(test);
        }
    }
    result.testsEnded();
    currentRepetition_++;
}